

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O2

void S2::GetFrame(S2Point *z,Matrix3x3_d *m)

{
  bool bVar1;
  S2Point local_58;
  Vector3<double> local_38;
  
  bVar1 = IsUnitLength(z);
  if (bVar1) {
    m->m_[0][2] = z->c_[0];
    m->m_[1][2] = z->c_[1];
    m->m_[2][2] = z->c_[2];
    Ortho(&local_58,z);
    m->m_[2][1] = local_58.c_[2];
    m->m_[0][1] = local_58.c_[0];
    m->m_[1][1] = local_58.c_[1];
    local_38.c_[0] = local_58.c_[0];
    local_38.c_[1] = local_58.c_[1];
    local_38.c_[2] = local_58.c_[2];
    Vector3<double>::CrossProd(&local_38,z);
    m->m_[0][0] = local_58.c_[0];
    m->m_[1][0] = local_58.c_[1];
    m->m_[2][0] = local_58.c_[2];
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
             ,0x67,kFatal,(ostream *)&std::cerr);
  std::operator<<((ostream *)local_58.c_[1],"Check failed: IsUnitLength(z) ");
  abort();
}

Assistant:

void GetFrame(const S2Point& z, Matrix3x3_d* m) {
  S2_DCHECK(IsUnitLength(z));
  m->SetCol(2, z);
  m->SetCol(1, Ortho(z));
  m->SetCol(0, m->Col(1).CrossProd(z));  // Already unit-length.
}